

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtCore.cpp
# Opt level: O0

JsErrorCode JsGetPromiseState(JsValueRef promise,JsPromiseState *state)

{
  anon_class_16_2_fc6820ff fn;
  JsErrorCode JVar1;
  JsPromiseState *local_18;
  JsPromiseState *state_local;
  JsValueRef promise_local;
  
  fn.state = &local_18;
  fn.promise = &state_local;
  local_18 = state;
  state_local = (JsPromiseState *)promise;
  JVar1 = ContextAPIWrapper<false,JsGetPromiseState::__0>(fn);
  return JVar1;
}

Assistant:

CHAKRA_API JsGetPromiseState(_In_ JsValueRef promise, _Out_ JsPromiseState *state)
{
    return ContextAPIWrapper<JSRT_MAYBE_TRUE>([&](Js::ScriptContext *scriptContext, TTDRecorder& _actionEntryPopper) -> JsErrorCode {
        PERFORM_JSRT_TTD_RECORD_ACTION_NOT_IMPLEMENTED(scriptContext);

        VALIDATE_INCOMING_REFERENCE(promise, scriptContext);
        PARAM_NOT_NULL(state);

        *state = JsPromiseStatePending;

        if (!Js::VarIs<Js::JavascriptPromise>(promise))
        {
            return JsErrorInvalidArgument;
        }

        Js::JavascriptPromise *jsPromise = Js::VarTo<Js::JavascriptPromise>(promise);
        Js::JavascriptPromise::PromiseStatus status = jsPromise->GetStatus();

        switch (status)
        {
        case Js::JavascriptPromise::PromiseStatus::PromiseStatusCode_HasRejection:
            *state = JsPromiseStateRejected;
            break;

        case Js::JavascriptPromise::PromiseStatus::PromiseStatusCode_HasResolution:
            *state = JsPromiseStateFulfilled;
            break;
        }

        return JsNoError;
    });
}